

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_modules(options_i *options,vw *all)

{
  typed_option<unsigned_long> *this;
  ostream *poVar1;
  void *pvVar2;
  long *in_RSI;
  undefined8 *in_RDI;
  option_group_definition rand_options;
  vw *in_stack_00000318;
  options_i *in_stack_00000320;
  vw *in_stack_00000d98;
  options_i *in_stack_00000da0;
  vw *in_stack_00001d58;
  options_i *in_stack_00001d60;
  vw *in_stack_000039c8;
  options_i *in_stack_000039d0;
  typed_option<unsigned_long> *in_stack_fffffffffffffd78;
  typed_option<unsigned_long> *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  typed_option<unsigned_long> *in_stack_fffffffffffffdc8;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [232];
  vw *in_stack_ffffffffffffff08;
  options_i *in_stack_ffffffffffffff10;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [56];
  long *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Randomization options",&local_69);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd80,
             (string *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"random_seed",&local_1e1);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffd88,(unsigned_long *)in_stack_fffffffffffffd80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"seed random number generator",&local_209);
  this = VW::config::typed_option<unsigned_long>::help
                   (in_stack_fffffffffffffd80,(string *)in_stack_fffffffffffffd78);
  VW::config::typed_option<unsigned_long>::typed_option
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)this,in_stack_fffffffffffffdc8);
  VW::config::typed_option<unsigned_long>::~typed_option(in_stack_fffffffffffffd80);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  VW::config::typed_option<unsigned_long>::~typed_option(in_stack_fffffffffffffd80);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  (**(code **)*local_8)(local_8,local_48);
  local_10[0x689] = local_10[0x688];
  parse_feature_tweaks(in_stack_000039d0,in_stack_000039c8);
  parse_example_tweaks(in_stack_00001d60,in_stack_00001d58);
  parse_output_model(in_stack_00000da0,in_stack_00000d98);
  parse_output_preds(in_stack_00000320,in_stack_00000318);
  parse_reductions(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if ((*(byte *)((long)local_10 + 0x3439) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)(local_10 + 0x1c),"Num weight bits = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(uint *)(local_10 + 10));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)(local_10 + 0x1c),"learning rate = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(float *)(local_10 + 0x6ac));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)(local_10 + 0x1c),"initial_t = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(*local_10 + 0x18));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)(local_10 + 0x1c),"power_t = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(float *)((long)local_10 + 0x334));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    if (1 < (ulong)local_10[0x69]) {
      poVar1 = std::operator<<((ostream *)(local_10 + 0x1c),"decay_learning_rate = ");
      in_stack_fffffffffffffd80 =
           (typed_option<unsigned_long> *)
           std::ostream::operator<<(poVar1,*(float *)((long)local_10 + 0x3564));
      std::ostream::operator<<(in_stack_fffffffffffffd80,std::endl<char,std::char_traits<char>>);
    }
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd80);
  return;
}

Assistant:

void parse_modules(options_i& options, vw& all)
{
  option_group_definition rand_options("Randomization options");
  rand_options.add(make_option("random_seed", all.random_seed).help("seed random number generator"));
  options.add_and_parse(rand_options);
  all.random_state = all.random_seed;

  parse_feature_tweaks(options, all);  // feature tweaks

  parse_example_tweaks(options, all);  // example manipulation

  parse_output_model(options, all);

  parse_output_preds(options, all);

  parse_reductions(options, all);

  if (!all.quiet)
  {
    all.trace_message << "Num weight bits = " << all.num_bits << endl;
    all.trace_message << "learning rate = " << all.eta << endl;
    all.trace_message << "initial_t = " << all.sd->t << endl;
    all.trace_message << "power_t = " << all.power_t << endl;
    if (all.numpasses > 1)
      all.trace_message << "decay_learning_rate = " << all.eta_decay_rate << endl;
  }
}